

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_Tokeniser.h
# Opt level: O2

TokenType __thiscall
soul::Tokeniser<soul::DummyKeywordMatcher,_soul::HEARTOperator::Matcher,_soul::IdentifierMatcher>::
parseNumericLiteral(Tokeniser<soul::DummyKeywordMatcher,_soul::HEARTOperator::Matcher,_soul::IdentifierMatcher>
                    *this,bool isNegative)

{
  bool bVar1;
  TokenType TVar2;
  CompileMessage local_50;
  
  bVar1 = parseHexLiteral(this);
  if (bVar1) {
    TVar2 = checkIntLiteralRange(this,isNegative);
    return (TokenType)TVar2.text;
  }
  bVar1 = parseFloatLiteral(this);
  if (bVar1) {
    TVar2.text = (this->literalType).text;
  }
  else {
    bVar1 = parseOctalLiteral(this);
    if (bVar1) {
      Errors::noOctalLiterals<>();
      (*this->_vptr_Tokeniser[2])(this,&local_50);
      CompileMessage::~CompileMessage(&local_50);
    }
    bVar1 = parseBinaryLiteral(this);
    if ((!bVar1) && (bVar1 = parseDecimalLiteral(this), !bVar1)) {
      Errors::errorInNumericLiteral<>();
      (*this->_vptr_Tokeniser[2])(this,&local_50);
      CompileMessage::~CompileMessage(&local_50);
      return (TokenType)(char *)0x0;
    }
    TVar2 = checkIntLiteralRange(this,isNegative);
  }
  return (TokenType)TVar2.text;
}

Assistant:

TokenType parseNumericLiteral (bool isNegative)
    {
        if (parseHexLiteral())      return checkIntLiteralRange (isNegative);
        if (parseFloatLiteral())    return literalType;
        if (parseOctalLiteral())    throwError (Errors::noOctalLiterals());
        if (parseBinaryLiteral())   return checkIntLiteralRange (isNegative);
        if (parseDecimalLiteral())  return checkIntLiteralRange (isNegative);

        throwError (Errors::errorInNumericLiteral());
        return {};
    }